

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

void __thiscall internalJSONNode::Fetch(internalJSONNode *this)

{
  uchar uVar1;
  allocator local_31;
  json_string local_30;
  internalJSONNode *local_10;
  internalJSONNode *this_local;
  
  if ((this->fetched & 1U) == 0) {
    local_10 = this;
    uVar1 = type(this);
    switch(uVar1) {
    case '\x01':
      FetchString(this);
      break;
    case '\x02':
      FetchNumber(this);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_30,"Fetching an unknown type",&local_31);
      JSONDebug::_JSON_FAIL(&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      Nullify(this);
      break;
    case '\x04':
      FetchArray(this);
      break;
    case '\x05':
      FetchNode(this);
    }
    this->fetched = true;
  }
  return;
}

Assistant:

void internalJSONNode::Fetch(void) const json_nothrow {
	   if (fetched) return;
	   switch (type()){
		  case JSON_STRING:
			 FetchString();
			 break;
		  case JSON_NODE:
			 FetchNode();
			 break;
		  case JSON_ARRAY:
			 FetchArray();
			 break;
		  case JSON_NUMBER:
			 FetchNumber();
			 break;
		  #if defined JSON_DEBUG || defined JSON_SAFE
			 default:
				JSON_FAIL(JSON_TEXT("Fetching an unknown type"));
				Nullify();
		  #endif 
	   }
	   fetched = true;
    }